

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O2

int anon_unknown.dwarf_111dc::RtMidiIn_ignoretypes(lua_State *L)

{
  MidiApi *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RtMidiIn *pRVar5;
  
  pRVar5 = getRtMidiIn(L,1);
  iVar2 = lua_toboolean(L,2);
  iVar3 = lua_toboolean(L,3);
  iVar4 = lua_toboolean(L,4);
  pMVar1 = (pRVar5->super_RtMidi).rtapi_;
  (*pMVar1->_vptr_MidiApi[0xb])(pMVar1,(ulong)(iVar2 != 0),(ulong)(iVar3 != 0),(ulong)(iVar4 != 0));
  return 0;
}

Assistant:

int RtMidiIn_ignoretypes(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	bool midiSysex = lua_toboolean(L, 2);
	bool midiTime = lua_toboolean(L, 3);
	bool midiSense = lua_toboolean(L, 4);
	self.ignoreTypes(midiSysex, midiTime, midiSense);
	return 0;
}